

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

double cmsys::SystemTools::GetTime(void)

{
  undefined1 local_18 [8];
  timeval t;
  
  gettimeofday((timeval *)local_18,(__timezone_ptr_t)0x0);
  return (double)(long)local_18 + (double)t.tv_sec * 1e-06;
}

Assistant:

double SystemTools::GetTime(void)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  FILETIME ft;
  GetSystemTimeAsFileTime(&ft);
  return (429.4967296 * ft.dwHighDateTime + 0.0000001 * ft.dwLowDateTime -
          11644473600.0);
#else
  struct timeval t;
  gettimeofday(&t, 0);
  return 1.0 * double(t.tv_sec) + 0.000001 * double(t.tv_usec);
#endif
}